

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLASTArithmeticExpression.cpp
# Opt level: O3

String * MathML::AST::ArithmeticExpression::operatorString_abi_cxx11_(Operator op)

{
  if (op < 4) {
    return (String *)(&PTR_OPERATOR_ARITHMETIC_ADD_abi_cxx11__009b6d28)[op];
  }
  return (String *)OPERATOR_ARITHMETIC_ILLEGAL_abi_cxx11_;
}

Assistant:

const String& ArithmeticExpression::operatorString( Operator op )
        {
            switch ( op )
            {

            case ADD:
                return OPERATOR_ARITHMETIC_ADD;

            case SUB:
                return OPERATOR_ARITHMETIC_SUB;

            case MUL:
                return OPERATOR_ARITHMETIC_MUL;

            case DIV:
                return OPERATOR_ARITHMETIC_DIV;
            }

            return OPERATOR_ARITHMETIC_ILLEGAL;
        }